

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::InstanceSymbol::resolvePortConnections(InstanceSymbol *this)

{
  Type *pTVar1;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> ports;
  bool bVar2;
  uint uVar3;
  uint n_;
  int iVar4;
  Scope *pSVar5;
  HierarchicalInstanceSyntax *args_1;
  reference ppSVar6;
  allocator<std::pair<const_unsigned_long,_unsigned_long>_> *paVar7;
  _Map_pointer args_2;
  size_t sVar8;
  group_type *pgVar9;
  value_type *pvVar10;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::PortConnection_*,_18446744073709551615UL> *__s;
  Symbol *in_RDI;
  PortConnection *conn;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> *__range2;
  iterator portIt;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> conns;
  SyntaxNode *syntax;
  Compilation *comp;
  Scope *scope;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> portList;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  unsigned_long *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Compilation *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  bitmask<slang::ast::CompilationFlags> in_stack_fffffffffffffcf4;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffcf8;
  InstanceSymbol *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  equal_to<unsigned_long> *in_stack_fffffffffffffd10;
  unsigned_long *in_stack_fffffffffffffd18;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffd20;
  Type *args_2_00;
  try_emplace_args_t *in_stack_fffffffffffffd70;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffd80;
  Symbol *local_270;
  undefined8 local_268;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_260;
  undefined1 local_248 [16];
  Type local_238;
  size_t sStack_1f0;
  Scope local_1e0;
  bitmask<slang::ast::CompilationFlags> local_19c;
  pointer local_198;
  Compilation *local_190;
  Scope *local_188;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_180;
  Compilation *local_168;
  Type *local_160;
  Type *local_158;
  undefined1 local_149 [9];
  Compilation *local_140;
  Type *local_138;
  Type *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
  local_b0;
  pointer local_98;
  _Map_pointer local_90;
  unsigned_long *local_88;
  Compilation *local_80;
  _Elt_pointer local_78;
  _Elt_pointer local_70;
  Type *local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *in_stack_ffffffffffffffa8;
  InstanceSymbol *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffc0;
  pow2_quadratic_prober local_30;
  _Map_pointer local_20;
  pointer local_18;
  unsigned_long *local_10;
  InstanceSymbol *in_stack_fffffffffffffff8;
  
  local_180 = InstanceBodySymbol::getPortList((InstanceBodySymbol *)in_stack_fffffffffffffce8);
  if (in_RDI[1].parentScope == (Scope *)0x0) {
    local_188 = Symbol::getParentScope(in_RDI);
    local_190 = Scope::getCompilation(local_188);
    pSVar5 = (Scope *)Compilation::allocPointerMap
                                ((Compilation *)
                                 CONCAT44(in_stack_fffffffffffffcf4.m_bits,in_stack_fffffffffffffcf0
                                         ));
    in_RDI[1].parentScope = pSVar5;
    local_198 = (pointer)Symbol::getSyntax(in_RDI);
    if ((local_198 == (pointer)0x0) ||
       (*(SyntaxKind *)&(local_198->_M_dataplus)._M_p != HierarchicalInstance)) {
      bVar2 = isTopLevel(in_stack_fffffffffffffd00);
      if (bVar2) {
        bitmask<slang::ast::CompilationFlags>::bitmask(&local_19c,AllowTopLevelIfacePorts);
        bVar2 = Compilation::hasFlag(in_stack_fffffffffffffce8,in_stack_fffffffffffffcf4);
        if (bVar2) {
          connectDefaultIfacePorts(in_stack_fffffffffffffff8);
        }
      }
    }
    else {
      SmallVector<const_slang::ast::PortConnection_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::PortConnection_*,_5UL> *)0x6e5e9a);
      local_238.canonical = (Type *)local_180._M_ptr;
      sStack_1f0 = local_180._M_extent._M_extent_value;
      args_1 = slang::syntax::SyntaxNode::as<slang::syntax::HierarchicalInstanceSyntax>
                         ((SyntaxNode *)local_198);
      ports._M_ptr._4_4_ = in_stack_ffffffffffffffbc;
      ports._M_ptr._0_4_ = in_stack_ffffffffffffffb8;
      ports._M_extent._M_extent_value = in_stack_ffffffffffffffc0._M_extent_value;
      PortConnection::makeConnections
                (in_stack_ffffffffffffffb0,ports,in_stack_ffffffffffffffa8,
                 (SmallVector<const_slang::ast::PortConnection_*,_5UL> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      local_238.super_Symbol.nextInScope =
           (Symbol *)
           std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffffce8);
      local_238.super_Symbol.parentScope = &local_1e0;
      local_238.super_Symbol.location =
           (SourceLocation)
           SmallVectorBase<const_slang::ast::PortConnection_*>::begin
                     ((SmallVectorBase<const_slang::ast::PortConnection_*> *)
                      local_238.super_Symbol.parentScope);
      local_238.super_Symbol.name._M_str =
           (char *)SmallVectorBase<const_slang::ast::PortConnection_*>::end
                             ((SmallVectorBase<const_slang::ast::PortConnection_*> *)
                              local_238.super_Symbol.parentScope);
      src = extraout_RDX;
      for (; local_238.super_Symbol.location != (SourceLocation)local_238.super_Symbol.name._M_str;
          local_238.super_Symbol.location =
               (SourceLocation)((long)local_238.super_Symbol.location + 8)) {
        local_238.super_Symbol.name._M_len = *(size_t *)local_238.super_Symbol.location;
        pTVar1 = (Type *)in_RDI[1].parentScope;
        local_248._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
             ::operator++((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                           *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4.m_bits);
        ppSVar6 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                  ::operator*((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                               *)(local_248 + 8));
        local_238.super_Symbol._0_8_ = *ppSVar6;
        local_248._0_8_ = local_238.super_Symbol.name._M_len;
        local_160 = &local_238;
        local_168 = (Compilation *)local_248;
        local_158 = pTVar1;
        local_140 = local_168;
        local_138 = local_160;
        local_130 = pTVar1;
        paVar7 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::al((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                       *)0x6e6032);
        boost::unordered::detail::foa::
        alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
        ::alloc_cted_or_fwded_key_type
                  ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
                    *)(local_149 + 1),paVar7,(unsigned_long *)local_138);
        local_78 = (_Elt_pointer)
                   boost::unordered::detail::foa::
                   alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
                   ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
                                  *)(local_149 + 1));
        local_70 = (_Elt_pointer)local_149;
        local_80 = local_140;
        local_68 = pTVar1;
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                   ::key_from<unsigned_long,unsigned_long>(local_78,local_140);
        args_2 = (_Map_pointer)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::hash_for<unsigned_long>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcf4.m_bits,in_stack_fffffffffffffcf0),
                            (unsigned_long *)in_stack_fffffffffffffce8);
        local_90 = args_2;
        local_98 = (pointer)boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                            ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                            *)CONCAT44(in_stack_fffffffffffffcf4.m_bits,
                                                       in_stack_fffffffffffffcf0),
                                           (size_t)in_stack_fffffffffffffce8);
        local_10 = local_88;
        local_20 = local_90;
        args_2_00 = pTVar1;
        local_18 = local_98;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,(size_t)local_98);
        do {
          sVar8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          pgVar9 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::groups((table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             *)0x6e6185);
          pgVar9 = pgVar9 + sVar8;
          uVar3 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            (in_stack_fffffffffffffcf8,
                             CONCAT44(in_stack_fffffffffffffcf4.m_bits,in_stack_fffffffffffffcf0));
          if (uVar3 != 0) {
            pvVar10 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::elements((table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                  *)0x6e61da);
            pvVar10 = pvVar10 + sVar8 * 0xf;
            do {
              n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffd10 =
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)0x6e622a);
              in_stack_fffffffffffffd18 = local_10;
              in_stack_fffffffffffffd20 =
                   (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    *)boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      ::key_from<std::pair<unsigned_long_const,unsigned_long>>
                                ((pair<const_unsigned_long,_unsigned_long> *)0x6e6257);
              bVar2 = std::equal_to<unsigned_long>::operator()
                                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
                                 (unsigned_long *)in_stack_fffffffffffffd20);
              if (bVar2) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
                ::table_locator(&local_b0,pgVar9,n_,pvVar10 + n_);
                goto LAB_006e635e;
              }
              uVar3 = uVar3 - 1 & uVar3;
            } while (uVar3 != 0);
          }
          in_stack_fffffffffffffd0f =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   CONCAT44(in_stack_fffffffffffffcf4.m_bits,
                                            in_stack_fffffffffffffcf0),
                                   (size_t)in_stack_fffffffffffffce8);
          if ((bool)in_stack_fffffffffffffd0f) {
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
            ::table_locator(&local_b0);
            goto LAB_006e635e;
          }
          bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,(size_t)(args_2_00->super_Symbol).name._M_len);
        } while (bVar2);
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
        ::table_locator(&local_b0);
LAB_006e635e:
        bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_b0);
        if (bVar2) {
          local_c0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     ::make_iterator((locator *)0x6e637e);
          local_c1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_260,&local_c0,&local_c1);
          src = extraout_RDX_00;
        }
        else if ((pTVar1->super_Symbol).nextInScope < (Symbol *)(pTVar1->super_Symbol).parentScope)
        {
          in_stack_fffffffffffffce8 = local_80;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    (in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
                     (size_t)in_stack_fffffffffffffd10,
                     (try_emplace_args_t *)
                     CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (unsigned_long *)in_stack_fffffffffffffd00,(unsigned_long *)args_2_00);
          local_d8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     ::make_iterator((locator *)0x6e641a);
          local_f1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_260,&local_d8,local_f1);
          src = extraout_RDX_01;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    (in_stack_fffffffffffffd80,(size_t)in_RDI,in_stack_fffffffffffffd70,
                     (unsigned_long *)args_1,(unsigned_long *)args_2);
          local_108 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::make_iterator((locator *)0x6e6492);
          local_121[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_260,&local_108,local_121);
          src = extraout_RDX_02;
        }
      }
      iVar4 = SmallVectorBase<const_slang::ast::PortConnection_*>::copy
                        ((SmallVectorBase<const_slang::ast::PortConnection_*> *)&local_1e0,
                         (EVP_PKEY_CTX *)local_190,src);
      std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::
      span<const_slang::ast::PortConnection_*,_18446744073709551615UL>
                ((span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *)
                 CONCAT44(extraout_var,iVar4),__s);
      in_RDI[1].nextInScope = local_270;
      *(undefined8 *)&in_RDI[1].indexInScope = local_268;
      SmallVector<const_slang::ast::PortConnection_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::PortConnection_*,_5UL> *)0x6e6591);
    }
  }
  return;
}

Assistant:

void InstanceSymbol::resolvePortConnections() const {
    // Note: the order of operations here is very subtly important.
    // In order to resolve connections, we need to actually know our list of ports.
    // Asking the body for the list of ports requires fully elaborating the instance,
    // especially because of things like non-ansi port declarations which might be
    // deep in the body. That process of elaboration can actually depend back on the
    // port connections because of interface ports.
    // For example:
    //
    //     interface I #(parameter int i) (); endinterface
    //     module M(I iface, input logic [iface.i - 1 : 0] foo);
    //         localparam int j = $bits(foo);
    //     endmodule
    //
    // In order to resolve connections for an instance of M, we elaborate its body,
    // which then requires evaluating $bits(foo) which then depends on the connection
    // provided to `iface`. In the code, this translates to a reetrant call to this
    // function; the first time we call getPortList() on the body will call back in here.
    auto portList = body.getPortList();
    if (connectionMap)
        return;

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    connectionMap = comp.allocPointerMap();

    auto syntax = getSyntax();
    if (!syntax || syntax->kind != SyntaxKind::HierarchicalInstance) {
        // If this is a top level module and we have interface ports, the user has
        // the option of allowing it by automatically instantiating interface instances
        // to connect them to.
        if (isTopLevel() && comp.hasFlag(CompilationFlags::AllowTopLevelIfacePorts))
            connectDefaultIfacePorts();
        return;
    }

    SmallVector<const PortConnection*> conns;
    PortConnection::makeConnections(*this, portList,
                                    syntax->as<HierarchicalInstanceSyntax>().connections, conns);

    auto portIt = portList.begin();
    for (auto conn : conns) {
        SLANG_ASSERT(portIt != portList.end());
        connectionMap->emplace(reinterpret_cast<uintptr_t>(*portIt++),
                               reinterpret_cast<uintptr_t>(conn));
    }

    SLANG_ASSERT(portIt == portList.end());
    connections = conns.copy(comp);
}